

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_send_file_body(mg_connection *conn,char *path)

{
  int iVar1;
  mg_file *in_RCX;
  int in_R8D;
  mg_file file;
  
  file.stat.is_directory = 0;
  file.stat.is_gzipped = 0;
  file.stat.location = 0;
  file.stat._28_4_ = 0;
  file.stat.size = 0;
  file.stat.last_modified = 0;
  file.access.fp = (FILE *)0x0;
  iVar1 = mg_fopen((mg_connection *)path,(char *)0x1,(int)&file,in_RCX);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    fclose_on_exec(&file.access,conn);
    iVar1 = 0;
    send_file_data(conn,&file,0,0x7fffffffffffffff,in_R8D);
    mg_fclose(&file.access);
  }
  return iVar1;
}

Assistant:

CIVETWEB_API int
mg_send_file_body(struct mg_connection *conn, const char *path)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	if (!mg_fopen(conn, path, MG_FOPEN_MODE_READ, &file)) {
		return -1;
	}
	fclose_on_exec(&file.access, conn);
	send_file_data(conn, &file, 0, INT64_MAX, 0); /* send static file */
	(void)mg_fclose(&file.access); /* Ignore errors for readonly files */
	return 0;                      /* >= 0 for OK */
}